

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_common.cpp
# Opt level: O3

int __thiscall pstore::brokerface::writer::writer(writer *this,UI *ui,UI_STRING *uis)

{
  undefined8 uVar1;
  _Manager_type p_Var2;
  uint in_ECX;
  undefined8 *in_R8;
  
  this->_vptr_writer = (_func_int **)&PTR__writer_00274420;
  fifo_path::open_client_pipe((fifo_path *)&this->fd_);
  (this->retry_timeout_).__r = (rep)uis;
  this->max_retries_ = in_ECX;
  *(undefined8 *)&(this->update_cb_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->update_cb_).super__Function_base._M_functor + 8) = 0;
  (this->update_cb_).super__Function_base._M_manager = (_Manager_type)0x0;
  p_Var2 = (_Manager_type)in_R8[3];
  (this->update_cb_)._M_invoker = (_Invoker_type)p_Var2;
  if (in_R8[2] != 0) {
    uVar1 = in_R8[1];
    *(undefined8 *)&(this->update_cb_).super__Function_base._M_functor = *in_R8;
    *(undefined8 *)((long)&(this->update_cb_).super__Function_base._M_functor + 8) = uVar1;
    p_Var2 = (_Manager_type)in_R8[2];
    (this->update_cb_).super__Function_base._M_manager = p_Var2;
    in_R8[2] = 0;
    in_R8[3] = 0;
  }
  return (int)p_Var2;
}

Assistant:

writer::writer (fifo_path const & fifo, duration_type const retry_timeout,
                        unsigned const max_retries, update_callback cb)
                : fd_{fifo.open_client_pipe ()}
                , retry_timeout_{retry_timeout}
                , max_retries_{max_retries}
                , update_cb_{std::move (cb)} {}